

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_x86_64-inl.h
# Opt level: O3

void google::DumpStackTrace(int skip_count,DebugWriter *writerfn,void *arg)

{
  long lVar1;
  bool bVar2;
  long **pplVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  long lVar5;
  void *stack [32];
  char buf [1024];
  trace_arg_t targ;
  long local_938 [32];
  long *local_838 [128];
  long *local_438;
  undefined8 local_430;
  int local_428;
  
  if (ready_to_run == '\x01') {
    local_438 = local_938;
    local_430 = 0x300000020;
    local_428 = 0;
    _Unwind_Backtrace(GetOneFrame,&local_438);
    lVar5 = (long)local_428;
    if (0 < lVar5) {
      lVar4 = 0;
      do {
        lVar1 = local_938[lVar4];
        if (fLB::FLAGS_symbolize_stacktrace == '\x01') {
          bVar2 = Symbolize((void *)(lVar1 + -1),(char *)&local_438,0x400);
          pplVar3 = (long **)"(unknown)";
          if (bVar2) {
            pplVar3 = &local_438;
          }
          snprintf((char *)local_838,0x400,"%s@ %*p  %s\n","    ",0x12,lVar1,pplVar3);
          pplVar3 = local_838;
        }
        else {
          snprintf((char *)&local_438,100,"%s@ %*p\n","    ",0x12,lVar1);
          pplVar3 = &local_438;
        }
        (*(code *)CONCAT44(in_register_0000003c,skip_count))(pplVar3,writerfn);
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
  }
  return;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  if (!ready_to_run)
    return 0;

  trace_arg_t targ;

  skip_count += 1;         // Do not include the "GetStackTrace" frame

  targ.result = result;
  targ.max_depth = max_depth;
  targ.skip_count = skip_count;
  targ.count = 0;

  _Unwind_Backtrace(GetOneFrame, &targ);

  return targ.count;
}